

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O2

int mbedtls_pk_parse_keyfile(mbedtls_pk_context *ctx,char *path,char *pwd)

{
  int iVar1;
  size_t pwdlen;
  uchar *buf;
  size_t n;
  uchar *local_38;
  size_t local_30;
  
  iVar1 = mbedtls_pk_load_file(path,&local_38,&local_30);
  if (iVar1 == 0) {
    if (pwd == (char *)0x0) {
      pwd = (char *)0x0;
      pwdlen = 0;
    }
    else {
      pwdlen = strlen(pwd);
    }
    iVar1 = mbedtls_pk_parse_key(ctx,local_38,local_30,(uchar *)pwd,pwdlen);
    mbedtls_platform_zeroize(local_38,local_30);
    free(local_38);
  }
  return iVar1;
}

Assistant:

int mbedtls_pk_parse_keyfile( mbedtls_pk_context *ctx,
                      const char *path, const char *pwd )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t n;
    unsigned char *buf;

    PK_VALIDATE_RET( ctx != NULL );
    PK_VALIDATE_RET( path != NULL );

    if( ( ret = mbedtls_pk_load_file( path, &buf, &n ) ) != 0 )
        return( ret );

    if( pwd == NULL )
        ret = mbedtls_pk_parse_key( ctx, buf, n, NULL, 0 );
    else
        ret = mbedtls_pk_parse_key( ctx, buf, n,
                (const unsigned char *) pwd, strlen( pwd ) );

    mbedtls_platform_zeroize( buf, n );
    mbedtls_free( buf );

    return( ret );
}